

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall Tigre::String::String(String *this,float i)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_38,vsnprintf,0x3a,"%f",(double)i);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

Tigre::String::String(float i){
    this->value = std::to_string(i);
}